

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSetTest_PartialSimple_Test::
TestBody(MessageDifferencerTest_RepeatedFieldSetTest_PartialSimple_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestField> *pRVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>_> *pVVar2;
  FieldDescriptor *field;
  char *in_R9;
  AssertHelper AStack_428;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_420;
  string local_418;
  AssertionResult gtest_ar_;
  TestDiffMessage a;
  TestDiffMessage c;
  TestDiffMessage b;
  MessageDifferencer differencer;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&a);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&b);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&c);
  pRVar1 = &a.field_0._impl_.rm_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.c_ = 1;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 2;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.c_ = 0;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 2;
  pRVar1 = &b.field_0._impl_.rm_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.c_ = 1;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 2;
  internal::RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
            (&pRVar1->super_RepeatedPtrFieldBase);
  pRVar1 = &c.field_0._impl_.rm_;
  internal::RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
            (&pRVar1->super_RepeatedPtrFieldBase);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.c_ = 1;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 2;
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::set_scope(&differencer,PARTIAL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"rm",(allocator<char> *)&gtest_ar_);
  field = GetFieldDescriptor(&a.super_Message,&local_418);
  util::MessageDifferencer::TreatAsSet(&differencer,field);
  std::__cxx11::string::~string((string *)&local_418);
  gtest_ar_.success_ =
       util::MessageDifferencer::Compare(&differencer,&b.super_Message,&a.super_Message);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_418,(internal *)&gtest_ar_,(AssertionResult *)"differencer.Compare(b, a)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x828,local_418._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_428,(Message *)&local_420);
    testing::internal::AssertHelper::~AssertHelper(&AStack_428);
    std::__cxx11::string::~string((string *)&local_418);
    if (local_420._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_420._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       util::MessageDifferencer::Compare(&differencer,&c.super_Message,&a.super_Message);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_418,(internal *)&gtest_ar_,(AssertionResult *)"differencer.Compare(c, a)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x829,local_418._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_428,(Message *)&local_420);
    testing::internal::AssertHelper::~AssertHelper(&AStack_428);
    std::__cxx11::string::~string((string *)&local_418);
    if (local_420._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_420._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&c);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&b);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&a);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSetTest_PartialSimple) {
  proto2_unittest::TestDiffMessage a, b, c;
  // message a: {
  //   rm { c: 1 }
  //   rm { c: 0 }
  // }
  a.add_rm()->set_c(1);
  a.add_rm()->set_c(0);
  // message b: {
  //   rm { c: 1 }
  //   rm {}
  // }
  b.add_rm()->set_c(1);
  b.add_rm();
  // message c: {
  //   rm {}
  //   rm { c: 1 }
  // }
  c.add_rm();
  c.add_rm()->set_c(1);
  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.TreatAsSet(GetFieldDescriptor(a, "rm"));
  EXPECT_TRUE(differencer.Compare(b, a));
  EXPECT_TRUE(differencer.Compare(c, a));
}